

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_message.cc
# Opt level: O0

bool google::protobuf::compiler::cpp::anon_unknown_0::HasHasMethod(FieldDescriptor *field)

{
  bool bVar1;
  CppType CVar2;
  FileDescriptor *file;
  FieldDescriptor *field_local;
  
  file = FieldDescriptor::file(field);
  bVar1 = HasFieldPresence(file);
  if (bVar1) {
    field_local._7_1_ = true;
  }
  else {
    CVar2 = FieldDescriptor::cpp_type(field);
    field_local._7_1_ = CVar2 == CPPTYPE_MESSAGE;
  }
  return field_local._7_1_;
}

Assistant:

bool HasHasMethod(const FieldDescriptor* field) {
  if (HasFieldPresence(field->file())) {
    // In proto1/proto2, every field has a has_$name$() method.
    return true;
  }
  // For message types without true field presence, only fields with a message
  // type have a has_$name$() method.
  return field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE;
}